

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

optional<slang::SourceLocation> __thiscall slang::parsing::Trivia::getExplicitLocation(Trivia *this)

{
  TriviaKind TVar1;
  _Storage<slang::SourceLocation,_true> _Var2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  Token *token;
  optional<slang::SourceLocation> oVar4;
  Token local_10;
  
  TVar1 = this->kind;
  _Var2._1_7_ = 0;
  _Var2._0_1_ = TVar1;
  if (TVar1 - 7 < 2) {
    local_10 = slang::syntax::SyntaxNode::getFirstToken((this->field_0).syntaxNode);
    token = &local_10;
LAB_0020a08a:
    _Var2._M_value = tokenLocationInclTrivia(token);
    in_RDX = extraout_RDX;
  }
  else {
    if (TVar1 == SkippedTokens) {
      token = (this->field_0).tokens.ptr;
      goto LAB_0020a08a;
    }
    if (this->hasFullLocation != true) {
      uVar3 = 0;
      goto LAB_0020a091;
    }
    _Var2 = (_Storage<slang::SourceLocation,_true>)((this->field_0).syntaxNode)->previewNode;
  }
  uVar3 = CONCAT71((int7)((ulong)in_RDX >> 8),1);
LAB_0020a091:
  oVar4.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._8_8_ = uVar3;
  oVar4.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceLocation>._M_payload._M_value = _Var2._M_value;
  return (optional<slang::SourceLocation>)
         oVar4.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceLocation>;
}

Assistant:

std::optional<SourceLocation> Trivia::getExplicitLocation() const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
            return tokenLocationInclTrivia(syntaxNode->getFirstToken());
        case TriviaKind::SkippedTokens:
            SLANG_ASSERT(tokens.len);
            return tokenLocationInclTrivia(tokens.ptr[0]);
        default:
            if (hasFullLocation)
                return fullLocation->location;

            return std::nullopt;
    }
}